

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall PeleLM::post_regrid(PeleLM *this,int lbase,int new_finest)

{
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int j;
  long lVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  double dVar15;
  Box local_12c;
  Array4<double> local_110;
  Array4<double> local_d0;
  MFIter mfi;
  
  NavierStokesBase::post_regrid(&this->super_NavierStokesBase,lbase,new_finest);
  if (do_set_rho_to_species_sum != 0) {
    if ((0 < *(((this->super_NavierStokesBase).super_AmrLevel.parent)->level_steps).
              super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start) &&
       (lbase < (this->super_NavierStokesBase).super_AmrLevel.level)) {
      this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           (((this->super_NavierStokesBase).super_AmrLevel.state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start)->new_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
      amrex::MFIter::MFIter
                (&mfi,(FabArrayBase *)
                      this_00.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,true);
      lVar1 = 9;
      while (mfi.currentIndex < mfi.endIndex) {
        amrex::MFIter::tilebox(&local_12c,&mfi);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_d0,
                   (FabArray<amrex::FArrayBox> *)
                   this_00.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi,3);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_110,
                   (FabArray<amrex::FArrayBox> *)
                   this_00.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi,first_spec);
        lVar12 = (long)local_12c.smallend.vect[0];
        lVar8 = (long)local_12c.smallend.vect[1];
        lVar9 = (long)local_12c.smallend.vect[2];
        if (clipSpeciesOnRegrid != 0) {
          pdVar2 = (double *)
                   ((lVar9 - local_110.begin.z) * local_110.kstride * 8 +
                    (lVar8 - local_110.begin.y) * local_110.jstride * 8 + lVar12 * 8 +
                    (long)local_110.begin.x * -8 + (long)local_110.p);
          for (lVar6 = lVar9; pdVar3 = pdVar2, lVar4 = lVar8, lVar6 <= local_12c.bigend.vect[2];
              lVar6 = lVar6 + 1) {
            for (; lVar4 <= local_12c.bigend.vect[1]; lVar4 = lVar4 + 1) {
              pdVar11 = pdVar3;
              lVar7 = lVar1;
              lVar10 = lVar12;
              pdVar5 = pdVar3;
              if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                do {
                  while (lVar7 != 0) {
                    dVar15 = *pdVar11;
                    if (1.79769313486232e+308 <= dVar15) {
                      dVar15 = 1.79769313486232e+308;
                    }
                    if (dVar15 <= 0.0) {
                      dVar15 = 0.0;
                    }
                    *pdVar11 = dVar15;
                    pdVar11 = pdVar11 + local_110.nstride;
                    lVar7 = lVar7 + -1;
                  }
                  lVar10 = lVar10 + 1;
                  pdVar11 = pdVar5 + 1;
                  lVar7 = lVar1;
                  pdVar5 = pdVar11;
                } while (local_12c.bigend.vect[0] + 1 != (int)lVar10);
              }
              pdVar3 = pdVar3 + local_110.jstride;
            }
            pdVar2 = pdVar2 + local_110.kstride;
          }
        }
        pdVar2 = (double *)
                 ((long)local_110.p +
                 (lVar9 - local_110.begin.z) * local_110.kstride * 8 +
                 (lVar8 - local_110.begin.y) * local_110.jstride * 8 + lVar12 * 8 +
                 (long)local_110.begin.x * -8);
        for (; lVar9 <= local_12c.bigend.vect[2]; lVar9 = lVar9 + 1) {
          lVar4 = (lVar9 - local_d0.begin.z) * local_d0.kstride;
          pdVar3 = pdVar2;
          for (lVar6 = lVar8; lVar6 <= local_12c.bigend.vect[1]; lVar6 = lVar6 + 1) {
            if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
              lVar10 = (lVar6 - local_d0.begin.y) * local_d0.jstride;
              lVar7 = lVar12;
              pdVar11 = pdVar3;
              do {
                local_d0.p[lVar4 + lVar10 + (lVar7 - local_d0.begin.x)] = 0.0;
                dVar15 = 0.0;
                pdVar5 = pdVar11;
                lVar13 = lVar1;
                while (bVar14 = lVar13 != 0, lVar13 = lVar13 + -1, bVar14) {
                  dVar15 = dVar15 + *pdVar5;
                  local_d0.p[lVar4 + lVar10 + (lVar7 - local_d0.begin.x)] = dVar15;
                  pdVar5 = pdVar5 + local_110.nstride;
                }
                lVar7 = lVar7 + 1;
                pdVar11 = pdVar11 + 1;
              } while (local_12c.bigend.vect[0] + 1 != (int)lVar7);
            }
            pdVar3 = pdVar3 + local_110.jstride;
          }
          pdVar2 = pdVar2 + local_110.kstride;
        }
        amrex::MFIter::operator++(&mfi);
      }
      amrex::MFIter::~MFIter(&mfi);
    }
    NavierStokesBase::make_rho_curr_time(&this->super_NavierStokesBase);
  }
  return;
}

Assistant:

void
PeleLM::post_regrid (int lbase,
                     int new_finest)
{
   BL_PROFILE("PLM::post_regrid()");
   NavierStokesBase::post_regrid(lbase, new_finest);
   //
   // FIXME: This may be necessary regardless, unless the interpolation
   //        to fine from coarse data preserves rho=sum(rho.Y)
   //
   if (!do_set_rho_to_species_sum) return;

   if (parent->levelSteps(0)>0 && level>lbase) {
      MultiFab& Snew = get_new_data(State_Type);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
      for (MFIter mfi(Snew,TilingIfNotGPU()); mfi.isValid(); ++mfi)
      {
         const Box& bx = mfi.tilebox();
         auto const& rho     = Snew.array(mfi,Density);
         auto const& rhoY    = Snew.array(mfi,first_spec);
         if (clipSpeciesOnRegrid) {
            amrex::ParallelFor(bx, [rhoY]
            AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
               fabMinMax( i, j, k, NUM_SPECIES, 0.0, Real_MAX, rhoY);
            });
         }
         amrex::ParallelFor(bx, [rho, rhoY]
         AMREX_GPU_DEVICE (int i, int j, int k) noexcept
         {
            rho(i,j,k) = 0.0;
            for (int n = 0; n < NUM_SPECIES; n++) {
               rho(i,j,k) += rhoY(i,j,k,n);
            }
         });
      }
   }
   make_rho_curr_time();
}